

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufferAddHead(xmlBufferPtr buf,xmlChar *str,int len)

{
  undefined4 uVar1;
  undefined4 uVar2;
  xmlChar *__src;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  if (str == (xmlChar *)0x0 || buf == (xmlBufferPtr)0x0) {
    iVar4 = 0x73;
  }
  else {
    if (len < 0) {
      len = xmlStrlen(str);
    }
    iVar4 = 0;
    if (len != 0) {
      if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        __src = buf->content;
        uVar6 = (int)__src - (int)buf->contentIO;
        if ((uint)len <= uVar6) {
          buf->content = __src + -(long)len;
          memmove(__src + -(long)len,str,(long)len);
          uVar1 = buf->use;
          uVar2 = buf->size;
          buf->use = len + uVar1;
          buf->size = len + uVar2;
          return 0;
        }
        uVar5 = buf->use;
        uVar3 = buf->size;
        if ((uint)len < (uVar3 + uVar6) - uVar5) {
          memmove(buf->contentIO + len,__src,(ulong)(uVar5 + 1));
          memmove(buf->contentIO,str,(long)len);
          buf->content = buf->contentIO;
          buf->use = buf->use + len;
          buf->size = buf->size + uVar6;
          return 0;
        }
      }
      else {
        uVar5 = buf->use;
        uVar3 = buf->size;
      }
      if (((uint)len < uVar3 - uVar5) || (iVar4 = xmlBufferGrow(buf,len), -1 < iVar4)) {
        memmove(buf->content + len,buf->content,(ulong)(buf->use + 1));
        memmove(buf->content,str,(long)len);
        buf->use = buf->use + len;
        iVar4 = 0;
      }
      else {
        iVar4 = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlBufferAddHead(xmlBufferPtr buf, const xmlChar *str, int len) {
    unsigned start = 0;

    if ((buf == NULL) || (str == NULL))
	return(XML_ERR_ARGUMENT);
    if (len < 0)
        len = xmlStrlen(str);
    if (len == 0)
        return(XML_ERR_OK);

    if (buf->alloc == XML_BUFFER_ALLOC_IO) {
        start = buf->content - buf->contentIO;

        /*
         * We can add it in the space previously shrunk
         */
        if ((unsigned) len <= start) {
            buf->content -= len;
            memmove(&buf->content[0], str, len);
            buf->use += len;
            buf->size += len;
            return(0);
        }
        if ((unsigned) len < buf->size + start - buf->use) {
            memmove(&buf->contentIO[len], buf->content, buf->use + 1);
            memmove(buf->contentIO, str, len);
            buf->content = buf->contentIO;
            buf->use += len;
            buf->size += start;
            return(0);
        }
    }

    if ((unsigned) len >= buf->size - buf->use) {
        if (xmlBufferGrow(buf, len) < 0)
            return(-1);
    }

    memmove(&buf->content[len], buf->content, buf->use + 1);
    memmove(buf->content, str, len);
    buf->use += len;
    return (0);
}